

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)29,(moira::Mode)2,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Imu<1> local_54;
  int local_50;
  Ims<1> local_48;
  int local_44;
  undefined1 local_3c [8];
  Ea<(moira::Mode)2,_1> dst;
  u32 src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  dst.ext3._2_2_ = op;
  dst.ext2 = dasmIncRead<1>(this,addr);
  Op<(moira::Mode)2,1>((Ea<(moira::Mode)2,_1> *)local_3c,this,dst.ext3._2_2_ & 7,addr);
  SVar1 = str->style->syntax;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    pSVar2 = StrWriter::operator<<(str);
    local_44 = (str->tab).raw;
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_44);
    Ims<1>::Ims(&local_48,dst.ext2);
    pSVar2 = StrWriter::operator<<(pSVar2,local_48);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)2,_1> *)local_3c);
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    local_50 = (str->tab).raw;
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_50);
    Imu<1>::Imu(&local_54,dst.ext2);
    pSVar2 = StrWriter::operator<<(pSVar2,local_54);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)2,_1> *)local_3c);
  }
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<S>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu<S>(src) << Sep{} << dst;
    }
}